

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall SubcommandProgram_Callbacks_Test::TestBody(SubcommandProgram_Callbacks_Test *this)

{
  App *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  AssertHelper local_b0;
  Message local_a8 [2];
  Success *anon_var_0;
  char *pcStack_90;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  iterator local_58;
  size_type local_50;
  anon_class_1_0_00000001 local_31;
  function<void_()> local_30;
  SubcommandProgram_Callbacks_Test *local_10;
  SubcommandProgram_Callbacks_Test *this_local;
  
  this_00 = (this->super_SubcommandProgram).start;
  local_10 = this;
  std::function<void()>::function<SubcommandProgram_Callbacks_Test::TestBody()::__0,void>
            ((function<void()> *)&local_30,&local_31);
  CLI::App::set_callback(this_00,&local_30);
  CLI::std::function<void_()>::~function(&local_30);
  TApp::run((TApp *)this);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"start",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_58 = &local_78;
  local_50 = 1;
  __l._M_len = 1;
  __l._M_array = local_58;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
  do {
    local_e0 = local_e0 + -1;
    std::__cxx11::string::~string((string *)local_e0);
  } while (local_e0 != &local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff70,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff70);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_90 = 
    "Expected: run() throws an exception of type CLI::Success.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x224,pcStack_90);
  testing::internal::AssertHelper::operator=(&local_b0,local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::Message::~Message(local_a8);
  return;
}

Assistant:

TEST_F(SubcommandProgram, Callbacks) {

    start->set_callback([]() { throw CLI::Success(); });

    run();

    app.reset();

    args = {"start"};

    EXPECT_THROW(run(), CLI::Success);
}